

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * Catch::
         StringMaker<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
         ::convert(wstring *wstr)

{
  bool bVar1;
  reference pwVar2;
  undefined8 in_RSI;
  string *in_RDI;
  wchar_t c;
  const_iterator __end1;
  const_iterator __begin1;
  wstring *__range1;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  char in_stack_ffffffffffffff87;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_50;
  undefined8 local_48;
  string local_30 [32];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30);
  std::__cxx11::wstring::size();
  std::__cxx11::string::reserve((ulong)local_30);
  local_48 = local_10;
  local_50._M_current = (wchar_t *)std::__cxx11::wstring::begin();
  std::__cxx11::wstring::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                       (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    pwVar2 = __gnu_cxx::
             __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             ::operator*(&local_50);
    if (*pwVar2 < L'Ā') {
      in_stack_ffffffffffffff87 = (char)*pwVar2;
    }
    else {
      in_stack_ffffffffffffff87 = '?';
    }
    std::__cxx11::string::operator+=(local_30,in_stack_ffffffffffffff87);
    __gnu_cxx::
    __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::operator++(&local_50);
  }
  Detail::stringify<std::__cxx11::string>(in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string StringMaker<std::wstring>::convert(const std::wstring& wstr) {
    std::string s;
    s.reserve(wstr.size());
    for (auto c : wstr) {
        s += (c <= 0xff) ? static_cast<char>(c) : '?';
    }
    return ::Catch::Detail::stringify(s);
}